

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PrefixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  Expression *pEVar3;
  SyntaxKind *in_RSI;
  ASTContext *in_RDI;
  Type *in_stack_00000008;
  ASTContext *in_stack_00000010;
  ExpressionSyntax *in_stack_00000018;
  Compilation *in_stack_00000020;
  bitmask<slang::ast::ASTFlags> in_stack_00000028;
  Diagnostic *diag;
  bool good;
  UnaryExpression *result;
  Type *type;
  Expression *operand;
  bitmask<slang::ast::ASTFlags> extraFlags;
  UnaryOperator op;
  Expression *in_stack_fffffffffffffe48;
  Compilation *in_stack_fffffffffffffe50;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe58;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffe60;
  Token *in_stack_fffffffffffffe70;
  SourceRange *in_stack_fffffffffffffe78;
  SourceRange *in_stack_fffffffffffffe80;
  Expression *in_stack_fffffffffffffe88;
  Type *in_stack_fffffffffffffe90;
  UnaryOperator *in_stack_fffffffffffffe98;
  SyntaxNode *in_stack_fffffffffffffea0;
  Expression *in_stack_fffffffffffffea8;
  ASTContext *this;
  bitmask<slang::ast::ASTFlags> local_30;
  UnaryOperator local_24;
  SyntaxKind *local_18;
  ASTContext *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24 = OpInfo::getUnary(*in_RSI);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30);
  bVar1 = OpInfo::isLValue(local_24);
  if (bVar1) {
    local_30 = ast::operator|((ASTFlags)in_stack_fffffffffffffe58,
                              (ASTFlags)in_stack_fffffffffffffe50);
  }
  this = local_10;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xf3caee);
  _Var2._M_extent_value =
       (size_t)Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                  in_stack_00000028,in_stack_00000008);
  not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xf3cb39);
  slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffea0);
  parsing::Token::range(in_stack_fffffffffffffe70);
  BumpAllocator::
  emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
            ((BumpAllocator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe50);
  if (bVar1) {
    pEVar3 = Expression::badExpr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    return pEVar3;
  }
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  syntax_00._M_extent._M_extent_value = _Var2._M_extent_value;
  syntax_00._M_ptr = (pointer)local_10;
  ASTContext::setAttributes(this,in_stack_fffffffffffffea8,syntax_00);
  pEVar3 = (Expression *)
           (*(code *)(&DAT_015e8b08 +
                     *(int *)(&DAT_015e8b08 + (ulong)(*local_18 - UnaryBitwiseAndExpression) * 4)))
                     ();
  return pEVar3;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PrefixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    auto op = OpInfo::getUnary(syntax.kind);
    bitmask<ASTFlags> extraFlags;
    if (OpInfo::isLValue(op))
        extraFlags = ASTFlags::LValue | ASTFlags::LAndRValue;

    Expression& operand = create(compilation, *syntax.operand, context, extraFlags);
    const Type* type = operand.type;

    auto result = compilation.emplace<UnaryExpression>(op, *type, operand, syntax.sourceRange(),
                                                       syntax.operatorToken.range());
    if (operand.bad())
        return badExpr(compilation, result);

    context.setAttributes(*result, syntax.attributes);

    bool good;
    switch (syntax.kind) {
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
            // Supported for both integral and real types. Result is same as input type.
            good = type->isNumeric();
            result->type = type;
            break;
        case SyntaxKind::UnaryLogicalNotExpression:
            // Supported for all boolean convertible types. Result is a single bit.
            good = type->isBooleanConvertible();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryBitwiseNotExpression:
            // Supported for integral only. Result is same as input type.
            good = type->isIntegral();
            result->type = type;
            break;
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
            // Supported for integral only. Result type is always a single bit.
            good = type->isIntegral();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            if ((context.flags.has(ASTFlags::NonProcedural) &&
                 !context.flags.has(ASTFlags::AssignmentAllowed)) ||
                context.flags.has(ASTFlags::AssignmentDisallowed)) {
                context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
                return badExpr(compilation, result);
            }

            // Supported for both integral and real types. Result is same as input type.
            // The operand must also be an assignable lvalue.
            good = type->isNumeric();
            result->type = type;
            if (!operand.requireLValue(context, syntax.operatorToken.location())) {
                return badExpr(compilation, result);
            }

            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}